

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transupp.c
# Opt level: O0

void do_drop(j_decompress_ptr srcinfo,j_compress_ptr dstinfo,JDIMENSION x_crop_offset,
            JDIMENSION y_crop_offset,jvirt_barray_ptr *src_coef_arrays,j_decompress_ptr dropinfo,
            jvirt_barray_ptr *drop_coef_arrays,JDIMENSION drop_width,JDIMENSION drop_height)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  jpeg_component_info *compptr;
  JBLOCKARRAY dst_buffer;
  JBLOCKARRAY src_buffer;
  int offset_y;
  int ci;
  JDIMENSION y_drop_blocks;
  JDIMENSION x_drop_blocks;
  JDIMENSION blk_y;
  JDIMENSION comp_height;
  JDIMENSION comp_width;
  int local_44;
  int local_40;
  uint local_34;
  
  for (local_40 = 0; local_40 < *(int *)(in_RSI + 0x4c); local_40 = local_40 + 1) {
    lVar5 = *(long *)(in_RSI + 0x58) + (long)local_40 * 0x60;
    uVar3 = (int)dst_buffer * *(int *)(lVar5 + 8);
    iVar1 = *(int *)(lVar5 + 0xc);
    uVar4 = in_EDX * *(int *)(lVar5 + 8);
    iVar2 = *(int *)(lVar5 + 0xc);
    for (local_34 = 0; local_34 < (uint)((int)src_buffer * iVar1);
        local_34 = *(int *)(lVar5 + 0xc) + local_34) {
      lVar6 = (**(code **)(*(long *)(in_RDI + 8) + 0x40))
                        (in_RDI,*(undefined8 *)(in_R8 + (long)local_40 * 8),
                         local_34 + in_ECX * iVar2,*(undefined4 *)(lVar5 + 0xc),1);
      if (local_40 < *(int *)(in_R9 + 0x38)) {
        lVar7 = (**(code **)(*(long *)(in_R9 + 8) + 0x40))
                          (in_R9,*(undefined8 *)(&compptr->component_id + (long)local_40 * 2),
                           local_34,*(undefined4 *)(lVar5 + 0xc),0);
        for (local_44 = 0; local_44 < *(int *)(lVar5 + 0xc); local_44 = local_44 + 1) {
          jcopy_block_row(*(undefined8 *)(lVar7 + (long)local_44 * 8),
                          *(long *)(lVar6 + (long)local_44 * 8) + (ulong)uVar4 * 0x80,uVar3);
        }
      }
      else {
        for (local_44 = 0; local_44 < *(int *)(lVar5 + 0xc); local_44 = local_44 + 1) {
          memset((void *)(*(long *)(lVar6 + (long)local_44 * 8) + (ulong)uVar4 * 0x80),0,
                 (ulong)uVar3 << 7);
        }
      }
    }
  }
  return;
}

Assistant:

LOCAL(void)
do_drop(j_decompress_ptr srcinfo, j_compress_ptr dstinfo,
        JDIMENSION x_crop_offset, JDIMENSION y_crop_offset,
        jvirt_barray_ptr *src_coef_arrays,
        j_decompress_ptr dropinfo, jvirt_barray_ptr *drop_coef_arrays,
        JDIMENSION drop_width, JDIMENSION drop_height)
/* Drop (insert) the contents of another image into the source image.  If the
 * number of components in the drop image is smaller than the number of
 * components in the destination image, then we fill in the remaining
 * components with zero.  This allows for dropping the contents of grayscale
 * images into (arbitrarily sampled) color images.
 */
{
  JDIMENSION comp_width, comp_height;
  JDIMENSION blk_y, x_drop_blocks, y_drop_blocks;
  int ci, offset_y;
  JBLOCKARRAY src_buffer, dst_buffer;
  jpeg_component_info *compptr;

  for (ci = 0; ci < dstinfo->num_components; ci++) {
    compptr = dstinfo->comp_info + ci;
    comp_width = drop_width * compptr->h_samp_factor;
    comp_height = drop_height * compptr->v_samp_factor;
    x_drop_blocks = x_crop_offset * compptr->h_samp_factor;
    y_drop_blocks = y_crop_offset * compptr->v_samp_factor;
    for (blk_y = 0; blk_y < comp_height; blk_y += compptr->v_samp_factor) {
      dst_buffer = (*srcinfo->mem->access_virt_barray)
        ((j_common_ptr)srcinfo, src_coef_arrays[ci], blk_y + y_drop_blocks,
         (JDIMENSION)compptr->v_samp_factor, TRUE);
      if (ci < dropinfo->num_components) {
        src_buffer = (*dropinfo->mem->access_virt_barray)
          ((j_common_ptr)dropinfo, drop_coef_arrays[ci], blk_y,
           (JDIMENSION)compptr->v_samp_factor, FALSE);
        for (offset_y = 0; offset_y < compptr->v_samp_factor; offset_y++) {
          jcopy_block_row(src_buffer[offset_y],
                          dst_buffer[offset_y] + x_drop_blocks, comp_width);
        }
      } else {
        for (offset_y = 0; offset_y < compptr->v_samp_factor; offset_y++) {
          MEMZERO(dst_buffer[offset_y] + x_drop_blocks,
                  comp_width * sizeof(JBLOCK));
        }
      }
    }
  }
}